

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlStaticCopyNode(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent,int extended)

{
  xmlElementType xVar1;
  int iVar2;
  xmlNs *in_RAX;
  xmlNodePtr pxVar3;
  xmlChar *pxVar4;
  xmlDocPtr pxVar5;
  xmlNsPtr pxVar6;
  xmlAttrPtr pxVar7;
  xmlEntityPtr pxVar8;
  xmlNodePtr pxVar9;
  _xmlNode *parent_00;
  xmlRegisterNodeFunc *pp_Var10;
  xmlNs *pxVar11;
  _xmlNode **pp_Var12;
  xmlNodePtr pxVar13;
  _xmlNode *p_Var14;
  _xmlNode *p_Var15;
  xmlNsPtr ns;
  xmlNsPtr local_38;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  switch(node->type) {
  case XML_ELEMENT_NODE:
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
  case XML_DOCUMENT_FRAG_NODE:
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    break;
  case XML_ATTRIBUTE_NODE:
    pxVar3 = (xmlNodePtr)xmlCopyPropInternal(doc,parent,(xmlAttrPtr)node);
    return pxVar3;
  default:
    return (xmlNodePtr)0x0;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar5 = xmlCopyDoc((xmlDocPtr)node,extended);
    return (xmlNodePtr)pxVar5;
  case XML_NAMESPACE_DECL:
    pxVar3 = (xmlNodePtr)xmlCopyNamespaceList((xmlNsPtr)node);
    return pxVar3;
  }
  local_38 = in_RAX;
  pxVar3 = (xmlNodePtr)(*xmlMalloc)(0x78);
  if (pxVar3 == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  pxVar3->nsDef = (xmlNs *)0x0;
  pxVar3->psvi = (void *)0x0;
  pxVar3->content = (xmlChar *)0x0;
  pxVar3->properties = (_xmlAttr *)0x0;
  pxVar3->doc = (_xmlDoc *)0x0;
  pxVar3->ns = (xmlNs *)0x0;
  pxVar3->next = (_xmlNode *)0x0;
  pxVar3->prev = (_xmlNode *)0x0;
  pxVar3->last = (_xmlNode *)0x0;
  pxVar3->parent = (_xmlNode *)0x0;
  pxVar3->name = (xmlChar *)0x0;
  pxVar3->children = (_xmlNode *)0x0;
  pxVar3->_private = (void *)0x0;
  *(undefined8 *)&pxVar3->type = 0;
  pxVar3->line = 0;
  pxVar3->extra = 0;
  *(undefined4 *)&pxVar3->field_0x74 = 0;
  xVar1 = node->type;
  pxVar3->type = xVar1;
  pxVar3->doc = doc;
  pxVar3->parent = parent;
  pxVar4 = node->name;
  if (pxVar4 == "text") {
    pxVar4 = "text";
LAB_0014bce2:
    pxVar3->name = pxVar4;
  }
  else {
    if (pxVar4 == "textnoenc") {
      pxVar4 = "textnoenc";
      goto LAB_0014bce2;
    }
    if (pxVar4 == "comment") {
      pxVar4 = "comment";
      goto LAB_0014bce2;
    }
    if (pxVar4 != (xmlChar *)0x0) {
      if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
        pxVar4 = xmlStrdup(pxVar4);
      }
      else {
        pxVar4 = xmlDictLookup(doc->dict,pxVar4,-1);
      }
      pxVar3->name = pxVar4;
      if (pxVar4 == (xmlChar *)0x0) goto LAB_0014bf3c;
      xVar1 = node->type;
    }
  }
  if (xVar1 == XML_ELEMENT_NODE) {
    pxVar3->line = node->line;
  }
  else if ((node->content != (xmlChar *)0x0) &&
          ((XML_XINCLUDE_END < xVar1 ||
           ((0x180020U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)))) {
    pxVar4 = xmlStrdup(node->content);
    pxVar3->content = pxVar4;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_0014bf3c;
  }
  if (extended == 0) goto LAB_0014bec5;
  xVar1 = node->type;
  if (((xVar1 == XML_XINCLUDE_START) || (xVar1 == XML_ELEMENT_NODE)) &&
     (node->nsDef != (xmlNsPtr)0x0)) {
    pxVar6 = xmlCopyNamespaceList(node->nsDef);
    pxVar3->nsDef = pxVar6;
    if (pxVar6 == (xmlNsPtr)0x0) goto LAB_0014bf3c;
    xVar1 = node->type;
  }
  if (xVar1 == XML_ELEMENT_NODE) {
    if (node->ns != (xmlNs *)0x0) {
      local_38 = (xmlNs *)0x0;
      iVar2 = xmlSearchNsSafe(pxVar3,node->ns->prefix,&local_38);
      if (iVar2 < 0) goto LAB_0014bf3c;
      if (local_38 == (xmlNs *)0x0) {
        iVar2 = xmlSearchNsSafe(node,node->ns->prefix,&local_38);
        if (iVar2 < 0) goto LAB_0014bf3c;
        p_Var15 = pxVar3;
        if (local_38 == (xmlNs *)0x0) {
          pxVar11 = xmlNewReconciledNs(pxVar3,node->ns);
        }
        else {
          do {
            pxVar13 = p_Var15;
            p_Var15 = pxVar13->parent;
          } while (p_Var15 != (_xmlNode *)0x0);
          pxVar11 = xmlNewNs(pxVar13,local_38->href,local_38->prefix);
        }
        pxVar3->ns = pxVar11;
        if (pxVar11 == (xmlNs *)0x0) goto LAB_0014bf3c;
      }
      else {
        pxVar3->ns = local_38;
      }
      xVar1 = node->type;
      if (xVar1 != XML_ELEMENT_NODE) goto LAB_0014bdb3;
    }
    if (node->properties != (xmlAttrPtr)0x0) {
      pxVar7 = xmlCopyPropList(pxVar3,node->properties);
      pxVar3->properties = pxVar7;
      if (pxVar7 == (xmlAttrPtr)0x0) goto LAB_0014bf3c;
      xVar1 = node->type;
      goto LAB_0014bdb3;
    }
  }
  else {
LAB_0014bdb3:
    if (xVar1 == XML_ENTITY_REF_NODE) {
      if ((doc == (xmlDocPtr)0x0) || (node->doc != doc)) {
        pxVar8 = xmlGetDocEntity(doc,pxVar3->name);
      }
      else {
        pxVar8 = (xmlEntityPtr)node->children;
      }
      pxVar3->children = (_xmlNode *)pxVar8;
      pxVar3->last = (_xmlNode *)pxVar8;
      goto LAB_0014bec5;
    }
  }
  p_Var15 = node->children;
  if (extended != 2 && p_Var15 != (xmlNodePtr)0x0) {
    pxVar9 = xmlStaticCopyNode(p_Var15,doc,pxVar3,2);
    pxVar13 = pxVar3;
    while (parent_00 = pxVar9, parent_00 != (_xmlNode *)0x0) {
      p_Var14 = pxVar13->last;
      if (p_Var14 != parent_00) {
        if (p_Var14 == (_xmlNode *)0x0) {
          pp_Var12 = &pxVar13->children;
        }
        else {
          parent_00->prev = p_Var14;
          pp_Var12 = &p_Var14->next;
        }
        *pp_Var12 = parent_00;
        pxVar13->last = parent_00;
      }
      if ((p_Var15->type == XML_ENTITY_REF_NODE) ||
         (p_Var14 = p_Var15->children, p_Var14 == (_xmlNode *)0x0)) {
        while (parent_00 = pxVar13, p_Var14 = p_Var15->next, p_Var14 == (_xmlNode *)0x0) {
          p_Var15 = p_Var15->parent;
          pxVar13 = parent_00->parent;
          if (p_Var15 == node) goto LAB_0014bec5;
        }
      }
      pxVar9 = xmlStaticCopyNode(p_Var14,doc,parent_00,2);
      p_Var15 = p_Var14;
      pxVar13 = parent_00;
    }
LAB_0014bf3c:
    xmlFreeNode(pxVar3);
    return (xmlNodePtr)0x0;
  }
LAB_0014bec5:
  if ((xmlRegisterCallbacks != 0) &&
     (pp_Var10 = __xmlRegisterNodeDefaultValue(), *pp_Var10 != (xmlRegisterNodeFunc)0x0)) {
    pp_Var10 = __xmlRegisterNodeDefaultValue();
    (**pp_Var10)(pxVar3);
  }
  return pxVar3;
}

Assistant:

xmlNodePtr
xmlStaticCopyNode(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent,
                  int extended) {
    xmlNodePtr ret;

    if (node == NULL) return(NULL);
    switch (node->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    break;
        case XML_ATTRIBUTE_NODE:
		return((xmlNodePtr) xmlCopyPropInternal(doc, parent, (xmlAttrPtr) node));
        case XML_NAMESPACE_DECL:
	    return((xmlNodePtr) xmlCopyNamespaceList((xmlNsPtr) node));

        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    return((xmlNodePtr) xmlCopyDoc((xmlDocPtr) node, extended));
        default:
            return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlNode));
    ret->type = node->type;

    ret->doc = doc;
    ret->parent = parent;
    if (node->name == xmlStringText)
	ret->name = xmlStringText;
    else if (node->name == xmlStringTextNoenc)
	ret->name = xmlStringTextNoenc;
    else if (node->name == xmlStringComment)
	ret->name = xmlStringComment;
    else if (node->name != NULL) {
        if ((doc != NULL) && (doc->dict != NULL))
	    ret->name = xmlDictLookup(doc->dict, node->name, -1);
	else
	    ret->name = xmlStrdup(node->name);
        if (ret->name == NULL)
            goto error;
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->content != NULL) &&
	(node->type != XML_ENTITY_REF_NODE) &&
	(node->type != XML_XINCLUDE_END) &&
	(node->type != XML_XINCLUDE_START)) {
	ret->content = xmlStrdup(node->content);
        if (ret->content == NULL)
            goto error;
    }else{
      if (node->type == XML_ELEMENT_NODE)
        ret->line = node->line;
    }

    if (!extended)
	goto out;
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->nsDef != NULL)) {
        ret->nsDef = xmlCopyNamespaceList(node->nsDef);
        if (ret->nsDef == NULL)
            goto error;
    }

    if ((node->type == XML_ELEMENT_NODE) && (node->ns != NULL)) {
        xmlNsPtr ns = NULL;
        int res;

	res = xmlSearchNsSafe(ret, node->ns->prefix, &ns);
        if (res < 0)
            goto error;
	if (ns == NULL) {
	    /*
	     * Humm, we are copying an element whose namespace is defined
	     * out of the new tree scope. Search it in the original tree
	     * and add it at the top of the new tree.
             *
             * TODO: Searching the original tree seems unnecessary. We
             * already have a namespace URI.
	     */
	    res = xmlSearchNsSafe(node, node->ns->prefix, &ns);
            if (res < 0)
                goto error;
	    if (ns != NULL) {
	        xmlNodePtr root = ret;

		while (root->parent != NULL) root = root->parent;
		ret->ns = xmlNewNs(root, ns->href, ns->prefix);
            } else {
                ret->ns = xmlNewReconciledNs(ret, node->ns);
	    }
            if (ret->ns == NULL)
                goto error;
	} else {
	    /*
	     * reference the existing namespace definition in our own tree.
	     */
	    ret->ns = ns;
	}
    }
    if ((node->type == XML_ELEMENT_NODE) && (node->properties != NULL)) {
        ret->properties = xmlCopyPropList(ret, node->properties);
        if (ret->properties == NULL)
            goto error;
    }
    if (node->type == XML_ENTITY_REF_NODE) {
	if ((doc == NULL) || (node->doc != doc)) {
	    /*
	     * The copied node will go into a separate document, so
	     * to avoid dangling references to the ENTITY_DECL node
	     * we cannot keep the reference. Try to find it in the
	     * target document.
	     */
	    ret->children = (xmlNodePtr) xmlGetDocEntity(doc, ret->name);
	} else {
            ret->children = node->children;
	}
	ret->last = ret->children;
    } else if ((node->children != NULL) && (extended != 2)) {
        xmlNodePtr cur, insert;

        cur = node->children;
        insert = ret;
        while (cur != NULL) {
            xmlNodePtr copy = xmlStaticCopyNode(cur, doc, insert, 2);
            if (copy == NULL)
                goto error;

            /* Check for coalesced text nodes */
            if (insert->last != copy) {
                if (insert->last == NULL) {
                    insert->children = copy;
                } else {
                    copy->prev = insert->last;
                    insert->last->next = copy;
                }
                insert->last = copy;
            }

            if ((cur->type != XML_ENTITY_REF_NODE) &&
                (cur->children != NULL)) {
                cur = cur->children;
                insert = copy;
                continue;
            }

            while (1) {
                if (cur->next != NULL) {
                    cur = cur->next;
                    break;
                }

                cur = cur->parent;
                insert = insert->parent;
                if (cur == node) {
                    cur = NULL;
                    break;
                }
            }
        }
    }

out:
    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)ret);
    return(ret);

error:
    xmlFreeNode(ret);
    return(NULL);
}